

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O3

char fsnav_init_gnss(fsnav_gnss *gnss)

{
  char cVar1;
  fsnav_gnss_gps *gps;
  fsnav_gnss_glo *glo;
  fsnav_gnss_gal *gal;
  fsnav_gnss_bds *bds;
  char *groupptr;
  size_t grouplen;
  char *local_18;
  size_t local_10;
  
  if (gnss == (fsnav_gnss *)0x0) {
    return '\0';
  }
  gnss->gps = (fsnav_gnss_gps *)0x0;
  cVar1 = fsnav_locatecfggroup("gps:",gnss->cfg,gnss->cfglength,&local_18,&local_10);
  if (cVar1 != '\0') {
    gps = (fsnav_gnss_gps *)calloc(1,0xa8);
    gnss->gps = gps;
    if (gps == (fsnav_gnss_gps *)0x0) {
      return '\0';
    }
    gps->cfg = local_18;
    gps->cfglength = local_10;
    cVar1 = fsnav_init_gnss_gps(gps,0x24,0x24);
    if (cVar1 == '\0') {
      return '\0';
    }
  }
  gnss->glo = (fsnav_gnss_glo *)0x0;
  cVar1 = fsnav_locatecfggroup("glo:",gnss->cfg,gnss->cfglength,&local_18,&local_10);
  if (cVar1 != '\0') {
    glo = (fsnav_gnss_glo *)calloc(1,0x68);
    gnss->glo = glo;
    if (glo == (fsnav_gnss_glo *)0x0) {
      return '\0';
    }
    glo->cfg = local_18;
    glo->cfglength = local_10;
    cVar1 = fsnav_init_gnss_glo(glo,0x24,0x18);
    if (cVar1 == '\0') {
      return '\0';
    }
  }
  gnss->gal = (fsnav_gnss_gal *)0x0;
  cVar1 = fsnav_locatecfggroup("gal:",gnss->cfg,gnss->cfglength,&local_18,&local_10);
  if (cVar1 != '\0') {
    gal = (fsnav_gnss_gal *)calloc(1,0x80);
    gnss->gal = gal;
    if (gal == (fsnav_gnss_gal *)0x0) {
      return '\0';
    }
    gal->cfg = local_18;
    gal->cfglength = local_10;
    cVar1 = fsnav_init_gnss_gal(gal,0x24,0x24);
    if (cVar1 == '\0') {
      return '\0';
    }
  }
  gnss->bds = (fsnav_gnss_bds *)0x0;
  cVar1 = fsnav_locatecfggroup("bds:",gnss->cfg,gnss->cfglength,&local_18,&local_10);
  if (cVar1 == '\0') {
LAB_00106c18:
    fsnav_locatecfggroup("",gnss->cfg,gnss->cfglength,&gnss->cfg_settings,&gnss->settings_length);
    *(undefined4 *)&(gnss->settings).sinEl_mask = 0;
    *(undefined4 *)((long)&(gnss->settings).sinEl_mask + 4) = 0;
    *(undefined4 *)&(gnss->settings).code_sigma = 0;
    *(undefined4 *)((long)&(gnss->settings).code_sigma + 4) = 0x40340000;
    (gnss->settings).phase_sigma = 0.01;
    (gnss->settings).doppler_sigma = 0.5;
    (gnss->settings).ant_pos[0] = 0.0;
    (gnss->settings).ant_pos[1] = 0.0;
    (gnss->settings).ant_pos[2] = 0.0;
    (gnss->settings).ant_pos_tol = -1.0;
    (gnss->settings).leap_sec_def = 0.0;
    cVar1 = fsnav_init_sol(&gnss->sol,gnss->cfg_settings,gnss->settings_length);
    if (cVar1 != '\0') {
      (gnss->epoch).s = 0.0;
      (gnss->epoch).Y = 0;
      (gnss->epoch).M = 0;
      (gnss->epoch).D = 0;
      (gnss->epoch).h = 0;
      (gnss->epoch).m = 0;
      gnss->leap_sec = 0;
      gnss->leap_sec_valid = '\0';
      return '\x01';
    }
    return '\0';
  }
  bds = (fsnav_gnss_bds *)calloc(1,0xa8);
  gnss->bds = bds;
  if (bds != (fsnav_gnss_bds *)0x0) {
    bds->cfg = local_18;
    bds->cfglength = local_10;
    cVar1 = fsnav_init_gnss_bds(bds,0x40,0x24);
    if (cVar1 != '\0') goto LAB_00106c18;
  }
  return '\0';
}

Assistant:

char fsnav_init_gnss(fsnav_gnss* gnss)
{
	// memory allocation limitations
	enum system_id                   {gps, glo, gal, bds};
	const size_t   max_sat_count[] = {36,  36,  36,  64 },
	               max_eph_count[] = {36,  24,  36,  36 };

	size_t grouplen;
	char*  groupptr;

	if (gnss == NULL)
		return 0;

	// gps
	gnss->gps = NULL;
	if (fsnav_locatecfggroup("gps:", gnss->cfg, gnss->cfglength, &groupptr, &grouplen)) {
		gnss->gps = (fsnav_gnss_gps*)calloc(1, sizeof(fsnav_gnss_gps));
		
		if (gnss->gps == NULL)
			return 0;
		
		gnss->gps->cfg = groupptr;
		gnss->gps->cfglength = grouplen;

		if (!fsnav_init_gnss_gps(gnss->gps, max_sat_count[gps], max_eph_count[gps]))
			return 0;
	}

	// glonass
	gnss->glo = NULL;
	if (fsnav_locatecfggroup( "glo:", gnss->cfg, gnss->cfglength, &groupptr, &grouplen)) {
		gnss->glo = (fsnav_gnss_glo*)calloc(1, sizeof(fsnav_gnss_glo));
		
		if (gnss->glo == NULL)
			return 0;
		
		gnss->glo->cfg = groupptr;
		gnss->glo->cfglength = grouplen;

		if (!fsnav_init_gnss_glo(gnss->glo, max_sat_count[glo], max_eph_count[glo]))
			return 0;
	}

	// galileo
	gnss->gal = NULL;
	if (fsnav_locatecfggroup("gal:", gnss->cfg, gnss->cfglength, &groupptr, &grouplen)) {
		gnss->gal = (fsnav_gnss_gal*)calloc(1, sizeof(fsnav_gnss_gal));
		
		if (gnss->gal == NULL)
			return 0;
		
		gnss->gal->cfg = groupptr;
		gnss->gal->cfglength = grouplen;

		if (!fsnav_init_gnss_gal(gnss->gal, max_sat_count[gal], max_eph_count[gal]))
			return 0;
	}

	// beidou
	gnss->bds = NULL;
	if (fsnav_locatecfggroup("bds:", gnss->cfg, gnss->cfglength, &groupptr, &grouplen)) {
		gnss->bds = (fsnav_gnss_bds*)calloc(1, sizeof(fsnav_gnss_bds));
		
		if (gnss->bds == NULL)
			return 0;
		
		gnss->bds->cfg = groupptr;
		gnss->bds->cfglength = grouplen;

		if (!fsnav_init_gnss_bds(gnss->bds, max_sat_count[bds], max_eph_count[bds]))
			return 0;
	}

	// gnss settings
	fsnav_init_gnss_settings(gnss);

	// gnss solution
	if (!fsnav_init_sol(&(gnss->sol), gnss->cfg_settings, gnss->settings_length))
		return 0;

	// gnss epoch
	fsnav_init_epoch(&(gnss->epoch));

	gnss->leap_sec = 0;
	gnss->leap_sec_valid = 0;

	return 1;
}